

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBox::QToolBox(QToolBox *this,QWidget *parent,WindowFlags f)

{
  long lVar1;
  QToolBoxPrivate *this_00;
  QToolBoxPrivate *pQVar2;
  QMargins *margins;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QToolBoxPrivate *d;
  undefined4 in_stack_ffffffffffffff98;
  ColorRole in_stack_ffffffffffffff9c;
  QFramePrivate *in_stack_ffffffffffffffa8;
  QFrame *in_stack_ffffffffffffffb0;
  QLayout *this_01;
  undefined8 in_stack_ffffffffffffffb8;
  QFlagsStorage<Qt::WindowType> f_00;
  
  f_00.i = (Int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QToolBoxPrivate *)operator_new(0x2a0);
  QToolBoxPrivate::QToolBoxPrivate(this_00);
  QFrame::QFrame(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(QWidget *)this_00,
                 (WindowFlags)f_00.i);
  *in_RDI = &PTR_metaObject_00d1f310;
  in_RDI[2] = &PTR__QToolBox_00d1f4d8;
  pQVar2 = d_func((QToolBox *)0x702e9a);
  margins = (QMargins *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout
            ((QVBoxLayout *)this_00,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pQVar2->layout = (QVBoxLayout *)margins;
  this_01 = (QLayout *)pQVar2->layout;
  QMargins::QMargins((QMargins *)this_00);
  QLayout::setContentsMargins(this_01,margins);
  QWidget::setBackgroundRole((QWidget *)this_00,in_stack_ffffffffffffff9c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBox::QToolBox(QWidget *parent, Qt::WindowFlags f)
    :  QFrame(*new QToolBoxPrivate, parent, f)
{
    Q_D(QToolBox);
    d->layout = new QVBoxLayout(this);
    d->layout->setContentsMargins(QMargins());
    setBackgroundRole(QPalette::Button);
}